

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadlib.c
# Opt level: O0

int lookforfunc(lua_State *L,char *path,char *sym)

{
  lua_CFunction fn;
  lua_CFunction f;
  void *reg;
  char *sym_local;
  char *path_local;
  lua_State *L_local;
  
  f = (lua_CFunction)checkclib(L,path);
  if (f == (lua_CFunction)0x0) {
    f = (lua_CFunction)lsys_load(L,path,(uint)(*sym == '*'));
    if (f == (lua_CFunction)0x0) {
      return 1;
    }
    addtoclib(L,path,f);
  }
  if (*sym == '*') {
    lua_pushboolean(L,1);
    L_local._4_4_ = 0;
  }
  else {
    fn = lsys_sym(L,f,sym);
    if (fn == (lua_CFunction)0x0) {
      L_local._4_4_ = 2;
    }
    else {
      lua_pushcclosure(L,fn,0);
      L_local._4_4_ = 0;
    }
  }
  return L_local._4_4_;
}

Assistant:

static int lookforfunc (lua_State *L, const char *path, const char *sym) {
  void *reg = checkclib(L, path);  /* check loaded C libraries */
  if (reg == NULL) {  /* must load library? */
    reg = lsys_load(L, path, *sym == '*');  /* global symbols if 'sym'=='*' */
    if (reg == NULL) return ERRLIB;  /* unable to load library */
    addtoclib(L, path, reg);
  }
  if (*sym == '*') {  /* loading only library (no function)? */
    lua_pushboolean(L, 1);  /* return 'true' */
    return 0;  /* no errors */
  }
  else {
    lua_CFunction f = lsys_sym(L, reg, sym);
    if (f == NULL)
      return ERRFUNC;  /* unable to find function */
    lua_pushcfunction(L, f);  /* else create new function */
    return 0;  /* no errors */
  }
}